

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O3

bool __thiscall dap::ContentReader::scan(ContentReader *this,uint8_t *seq,size_t len)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = buffer(this,len);
  if (bVar1) {
    do {
      bVar1 = match(this,seq,len);
      if (bVar1) {
        return bVar1;
      }
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->buf);
      bVar2 = buffer(this,len);
    } while (bVar2);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ContentReader::scan(const uint8_t* seq, size_t len) {
  while (buffer(len)) {
    if (match(seq, len)) {
      return true;
    }
    buf.pop_front();
  }
  return false;
}